

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_assignment_t * ztast_assignment(ztast_t *ast,ztast_id_t *id,ztast_expr_t *expr)

{
  ztast_expr *in_RDX;
  ztast_id *in_RSI;
  long in_RDI;
  ztast_assignment_t *ass;
  ztast_assignment_t *local_8;
  
  local_8 = (ztast_assignment_t *)(**(code **)(in_RDI + 8))(0x10,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_assignment_t *)0x0) {
    local_8 = (ztast_assignment_t *)0x0;
  }
  else {
    local_8->id = in_RSI;
    local_8->expr = in_RDX;
  }
  return local_8;
}

Assistant:

ztast_assignment_t *ztast_assignment(ztast_t      *ast,
                                     ztast_id_t   *id,
                                     ztast_expr_t *expr)
{
  ztast_assignment_t *ass;

  assert(ast);
  assert(id);
  assert(expr);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_assignment\n");
#endif

  ass = ZTAST_MALLOC(sizeof(*ass));
  if (ass == NULL)
    return NULL;

  ass->id   = id;
  ass->expr = expr;

  return ass;
}